

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O1

int menu_item_left_offset_proc(Am_Object *self)

{
  bool bVar1;
  uint uVar2;
  Am_Value *in_value;
  Am_Widget_Look look;
  Am_Widget_Look local_24;
  Am_Object local_20;
  Am_Object local_18;
  
  in_value = Am_Object::Get(self,0x17f,0);
  local_24.value = Am_MOTIF_LOOK_val;
  if ((in_value->type != 1) && (in_value->type != Am_Widget_Look::Am_Widget_Look_ID)) {
    Am_Widget_Look::TypeError(&local_24,in_value);
  }
  local_24.value = (Am_Widget_Look_vals)(in_value->value).float_value;
  Am_Object::Get_Object(&local_18,(Am_Slot_Key)self,10);
  Am_Object::Am_Object(&local_20,&Am_Menu_Bar);
  bVar1 = Am_Object::Is_Instance_Of(&local_18,&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  if ((float)local_24.value == 2.8026e-45) {
    uVar2 = (uint)!bVar1 * 4 + 0xb;
  }
  else if ((float)local_24.value == 1.4013e-45) {
    uVar2 = (uint)!bVar1 << 4 | 6;
  }
  else {
    if ((float)local_24.value != 0.0) {
      Am_Error("Unknown Look parameter");
    }
    uVar2 = 0xf;
    if (bVar1) {
      uVar2 = 5;
    }
  }
  return uVar2;
}

Assistant:

Am_Define_Formula(int, menu_item_left_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  bool menuBarItem = false;
  if (self.Get_Owner().Is_Instance_Of(Am_Menu_Bar))
    // is this item in the menu bar
    menuBarItem = true;
  return menu_item_left_offset_internal(look, menuBarItem);
}